

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void edition_unittest::TestEagerMaybeLazy::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  TestEagerMaybeLazy **v1;
  TestEagerMaybeLazy **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  uint32_t *puVar3;
  TestAllTypes *pTVar4;
  TestEagerMaybeLazy_NestedMessage *pTVar5;
  LogMessage local_e0;
  Voidify local_ca;
  byte local_c9;
  LogMessage local_c8;
  Voidify local_b2;
  byte local_b1;
  LogMessage local_b0;
  Voidify local_99;
  uint local_98;
  uint32_t cached_has_bits;
  LogMessage local_88;
  Voidify local_71;
  TestEagerMaybeLazy *local_70;
  Nullable<const_char_*> local_68;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestEagerMaybeLazy *from;
  TestEagerMaybeLazy *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_30;
  void *local_28;
  Nullable<const_char_*> local_20;
  void *local_18;
  Nullable<const_char_*> local_10;
  
  arena = (Arena *)from_msg;
  from = (TestEagerMaybeLazy *)to_msg;
  _this = (TestEagerMaybeLazy *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_70 = (TestEagerMaybeLazy *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestEagerMaybeLazy_const*>(&local_70);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestEagerMaybeLazy*>(&from);
  local_68 = absl::lts_20250127::log_internal::
             Check_NEImpl<edition_unittest::TestEagerMaybeLazy_const*,edition_unittest::TestEagerMaybeLazy*>
                       (v1,v2,"&from != _this");
  if (local_68 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_68);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_88,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
               ,0x6570,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_88);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_71,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_88);
  }
  local_98 = 0;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&(arena->impl_).field_0x10,0);
  local_98 = *puVar3;
  if ((local_98 & 7) != 0) {
    if ((local_98 & 1) != 0) {
      local_b1 = 0;
      if ((arena->impl_).mutex_.mu_.super___atomic_base<long>._M_i == 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x6577,"from._impl_.message_foo_ != nullptr");
        local_b1 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_99,pLVar2);
      }
      if ((local_b1 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b0);
      }
      if ((from->field_0)._impl_.message_foo_ == (TestAllTypes *)0x0) {
        local_28 = (void *)(arena->impl_).mutex_.mu_.super___atomic_base<long>._M_i;
        local_20 = absl_log_internal_check_op_result;
        pTVar4 = (TestAllTypes *)
                 google::protobuf::Arena::CopyConstruct<edition_unittest::TestAllTypes>
                           ((Arena *)absl_log_internal_check_op_result,local_28);
        (from->field_0)._impl_.message_foo_ = pTVar4;
      }
      else {
        edition_unittest::TestAllTypes::MergeFrom
                  ((from->field_0)._impl_.message_foo_,
                   (TestAllTypes *)(arena->impl_).mutex_.mu_.super___atomic_base<long>._M_i);
      }
    }
    if ((local_98 & 2) != 0) {
      local_c9 = 0;
      if ((arena->impl_).head_._M_b._M_p == (__pointer_type)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x657f,"from._impl_.message_bar_ != nullptr");
        local_c9 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_c8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_b2,pLVar2);
      }
      if ((local_c9 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_c8);
      }
      if ((from->field_0)._impl_.message_bar_ == (TestAllTypes *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).head_._M_b._M_p;
        local_30 = absl_log_internal_check_op_result;
        pTVar4 = (TestAllTypes *)
                 google::protobuf::Arena::CopyConstruct<edition_unittest::TestAllTypes>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.message_bar_ = pTVar4;
      }
      else {
        edition_unittest::TestAllTypes::MergeFrom
                  ((from->field_0)._impl_.message_bar_,
                   (TestAllTypes *)(arena->impl_).head_._M_b._M_p);
      }
    }
    if ((local_98 & 4) != 0) {
      if ((arena->impl_).first_owner_ == (void *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x6587,"from._impl_.message_baz_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_e0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_ca,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_e0);
      }
      if ((from->field_0)._impl_.message_baz_ == (TestEagerMaybeLazy_NestedMessage *)0x0) {
        local_18 = (arena->impl_).first_owner_;
        local_10 = absl_log_internal_check_op_result;
        pTVar5 = (TestEagerMaybeLazy_NestedMessage *)
                 google::protobuf::Arena::
                 CopyConstruct<edition_unittest::TestEagerMaybeLazy_NestedMessage>
                           ((Arena *)absl_log_internal_check_op_result,local_18);
        (from->field_0)._impl_.message_baz_ = pTVar5;
      }
      else {
        TestEagerMaybeLazy_NestedMessage::MergeFrom
                  ((from->field_0)._impl_.message_baz_,
                   (TestEagerMaybeLazy_NestedMessage *)(arena->impl_).first_owner_);
      }
    }
  }
  uVar1 = local_98;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestEagerMaybeLazy::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestEagerMaybeLazy*>(&to_msg);
  auto& from = static_cast<const TestEagerMaybeLazy&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestEagerMaybeLazy)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.message_foo_ != nullptr);
      if (_this->_impl_.message_foo_ == nullptr) {
        _this->_impl_.message_foo_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.message_foo_);
      } else {
        _this->_impl_.message_foo_->MergeFrom(*from._impl_.message_foo_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.message_bar_ != nullptr);
      if (_this->_impl_.message_bar_ == nullptr) {
        _this->_impl_.message_bar_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.message_bar_);
      } else {
        _this->_impl_.message_bar_->MergeFrom(*from._impl_.message_bar_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.message_baz_ != nullptr);
      if (_this->_impl_.message_baz_ == nullptr) {
        _this->_impl_.message_baz_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.message_baz_);
      } else {
        _this->_impl_.message_baz_->MergeFrom(*from._impl_.message_baz_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}